

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsXMLReader.cxx
# Opt level: O0

string * __thiscall kws::XMLReader::GetValue(XMLReader *this,string *tag)

{
  int iVar1;
  long lVar2;
  char *__s1;
  char *__s2;
  long in_RSI;
  string *in_RDI;
  bool bVar3;
  string tagt;
  XMLReader *in_stack_000000f8;
  string local_58 [32];
  string local_38 [56];
  
  *(undefined8 *)(in_RSI + 0x268) = 0;
  GetTag_abi_cxx11_(in_stack_000000f8);
  while( true ) {
    lVar2 = std::__cxx11::string::length();
    bVar3 = false;
    if (lVar2 != 0) {
      __s1 = (char *)std::__cxx11::string::c_str();
      __s2 = (char *)std::__cxx11::string::c_str();
      iVar1 = strcmp(__s1,__s2);
      bVar3 = iVar1 != 0;
    }
    if (!bVar3) break;
    GetTag_abi_cxx11_(in_stack_000000f8);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
  }
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x208));
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string XMLReader::GetValue(std::string tag)
{
  m_CurrentPos = 0;
  std::string tagt = this->GetTag();
  while((tagt.length()>0)  && (strcmp(tagt.c_str(),tag.c_str())))
    {
    tagt = this->GetTag();
    }

  return m_Value;
}